

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test::
~TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test
          (TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Fail)
{
	tst->setTestName("'[]\n\r");
	TestFailure fail(tst, "failfile", 20, "failure message");
	tcout->printFailure(fail);
	const char* expected =
		"##teamcity[testFailed name='|'|[|]|n|r' message='TEST failed (file:10): failfile:20' "
		"details='failure message']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}